

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<1024>,Blob<256>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<1024> *k,
               vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  Blob<256> h;
  Blob<256> local_50;
  
  Blob<256>::Blob(&local_50);
  while (start < 0x400) {
    flipbit(k,0x80,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0x80,0,&local_50);
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back(hashes,&local_50);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<1024>,Blob<256>>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0x80,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}